

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::SetCurrentSourceDirectory(cmMakefile *this,string *dir)

{
  char *value;
  allocator local_31;
  string local_30;
  
  cmState::Snapshot::SetCurrentSourceDirectory(&this->StateSnapshot,dir);
  std::__cxx11::string::string((string *)&local_30,"CMAKE_CURRENT_SOURCE_DIR",&local_31);
  value = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  AddDefinition(this,&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmMakefile::SetCurrentSourceDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentSourceDirectory(dir);
  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->StateSnapshot.GetCurrentSourceDirectory());
}